

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O0

QVariant * qDateTimeFromString(QString *val)

{
  bool bVar1;
  qsizetype qVar2;
  longlong lVar3;
  ulong uVar4;
  QString *in_RSI;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff90;
  QString *pQVar5;
  DateFormat format;
  QString *in_stack_ffffffffffffff98;
  QDateTime local_28 [10];
  QChar local_1e;
  QChar local_1c;
  QChar local_1a;
  QChar local_18;
  QChar local_16;
  QChar local_14;
  QChar local_12;
  QDateTime local_10 [8];
  long local_8;
  
  format = (DateFormat)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x10bf19);
  if (bVar1) {
    QDateTime::QDateTime(local_10);
    QVariant::QVariant(in_RDI,local_10);
    QDateTime::~QDateTime(local_10);
  }
  else {
    qVar2 = QString::size(in_RSI);
    if (qVar2 == 0xe) {
      pQVar5 = in_RSI;
      QChar::QChar<char16_t,_true>(&local_12,L'-');
      in_stack_ffffffffffffff98 = (QString *)QString::insert((longlong)pQVar5,(QChar)0x4);
      format = (DateFormat)((ulong)pQVar5 >> 0x20);
      QChar::QChar<char16_t,_true>(&local_14,L'-');
      lVar3 = QString::insert((longlong)in_stack_ffffffffffffff98,(QChar)0x7);
      QChar::QChar<char16_t,_true>(&local_16,L'T');
      lVar3 = QString::insert(lVar3,(QChar)0xa);
      QChar::QChar<char16_t,_true>(&local_18,L':');
      lVar3 = QString::insert(lVar3,(QChar)0xd);
      QChar::QChar<char16_t,_true>(&local_1a,L':');
      QString::insert(lVar3,(QChar)0x10);
    }
    QChar::QChar<char16_t,_true>(&local_1c,L'Z');
    uVar4 = QString::endsWith((QChar)(char16_t)in_RSI,(uint)(ushort)local_1c.ucs);
    if ((uVar4 & 1) == 0) {
      QChar::QChar<char16_t,_true>(&local_1e,L'Z');
      QString::append((QChar)(char16_t)in_RSI);
    }
    QDateTime::fromString(in_stack_ffffffffffffff98,format);
    QVariant::QVariant(in_RDI,local_28);
    QDateTime::~QDateTime(local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static inline QVariant qDateTimeFromString(QString &val)
{
#if !QT_CONFIG(datestring)
    Q_UNUSED(val);
    return QVariant(val);
#else
    if (val.isEmpty())
        return QVariant(QDateTime());

    // TIMESTAMPS have either the format "yyyyMMddhhmmss" or "yyyy-MM-dd
    // hh:mm:ss". QDateTime::fromString() can convert the latter, but not the
    // former, so adapt it if necessary.
    if (val.size() == 14)
        val.insert(4, u'-').insert(7, u'-').insert(10, u'T').insert(13, u':').insert(16, u':');

    if (!val.endsWith(u'Z'))
        val.append(u'Z');       // make UTC
    return QVariant(QDateTime::fromString(val, Qt::ISODate));
#endif
}